

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O2

Abc_Obj_t * Abc_NtkAreaOptOne(Sfm_Dec_t *p,int i)

{
  Sfm_Par_t *pPars;
  Abc_Ntk_t *pNtk;
  int iVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  abctime aVar4;
  abctime aVar5;
  int i_00;
  
  pPars = p->pPars;
  pNtk = p->pNtk;
  pAVar3 = Abc_NtkObj(pNtk,i);
  if (((pPars->nMffcMin < 2) ||
      (iVar1 = Abc_NodeMffcLabel(pAVar3,(Vec_Ptr_t *)0x0), pPars->nMffcMin <= iVar1)) &&
     (iVar1 = pPars->iNodeOne, iVar1 == 0 || iVar1 == i)) {
    if (iVar1 != 0) {
      pPars->fVeryVerbose = (uint)(iVar1 == i);
    }
    p->nNodesTried = p->nNodesTried + 1;
    aVar4 = Abc_Clock();
    iVar1 = Sfm_DecExtract(pNtk,pPars,pAVar3,&p->vObjRoots,&p->vObjGates,&p->vObjFanins,&p->vObjMap,
                           &p->vGateTfi,&p->vGateTfo,&p->vObjMffc,&p->vObjInMffc,(Sfm_Tim_t *)0x0,
                           (Sfm_Mit_t *)0x0);
    p->nDivs = iVar1;
    aVar5 = Abc_Clock();
    p->timeWin = p->timeWin + (aVar5 - aVar4);
    if ((pPars->nWinSizeMax == 0) || ((p->vObjGates).nSize <= pPars->nWinSizeMax)) {
      p->nMffc = (p->vObjMffc).nSize;
      iVar1 = Sfm_DecMffcArea(pNtk,&p->vObjMffc);
      p->AreaMffc = iVar1;
      iVar1 = p->nDivs;
      iVar2 = p->nMaxDivs;
      if (p->nMaxDivs <= iVar1) {
        iVar2 = iVar1;
      }
      p->nMaxDivs = iVar2;
      p->nAllDivs = p->nAllDivs + (long)iVar1;
      p->iTarget = (pAVar3->field_6).iTemp;
      iVar1 = (p->vObjGates).nSize;
      iVar2 = p->nMaxWin;
      if (p->nMaxWin <= iVar1) {
        iVar2 = iVar1;
      }
      p->nMaxWin = iVar2;
      p->nAllWin = p->nAllWin + (long)iVar1;
      aVar4 = Abc_Clock();
      iVar2 = Sfm_DecPrepareSolver(p);
      aVar5 = Abc_Clock();
      p->timeCnf = p->timeCnf + (aVar5 - aVar4);
      if (iVar2 != 0) {
        aVar4 = Abc_Clock();
        iVar2 = Sfm_DecPeformDec2(p,pAVar3);
        if (iVar2 < 0 && pPars->fMoreEffort != 0) {
          i_00 = (p->vObjInMffc).nSize;
          do {
            if (i_00 < 1) goto LAB_0044d254;
            i_00 = i_00 + -1;
            iVar2 = Vec_IntEntry(&p->vObjInMffc,i_00);
            p->iUseThis = iVar2;
            iVar2 = Sfm_DecPeformDec2(p,pAVar3);
            p->iUseThis = -1;
          } while (iVar2 < 0);
          p->nEfforts = p->nEfforts + 1;
        }
LAB_0044d254:
        if (p->pPars->fVeryVerbose != 0) {
          puts("\n");
        }
        aVar5 = Abc_Clock();
        p->timeSat = p->timeSat + (aVar5 - aVar4);
        if (-1 < iVar2) {
          p->nNodesChanged = p->nNodesChanged + 1;
          Abc_NtkCountStats(p,iVar1);
          pAVar3 = Sfm_DecInsert(pNtk,pAVar3,iVar1,&p->vObjGates,&p->vObjFanins,&p->vObjMap,
                                 &p->vGateHands,p->GateBuffer,p->GateInvert,&p->vGateFuncs,
                                 (Vec_Int_t *)0x0,p->pMit);
          return pAVar3;
        }
      }
    }
  }
  return (Abc_Obj_t *)0x0;
}

Assistant:

Abc_Obj_t * Abc_NtkAreaOptOne( Sfm_Dec_t * p, int i )
{
    abctime clk;
    Abc_Ntk_t * pNtk = p->pNtk;
    Sfm_Par_t * pPars = p->pPars;
    Abc_Obj_t * pObj = Abc_NtkObj( p->pNtk, i ); 
    int Limit, RetValue;
    if ( pPars->nMffcMin > 1 && Abc_NodeMffcLabel(pObj, NULL) < pPars->nMffcMin )
        return NULL;
    if ( pPars->iNodeOne && i != pPars->iNodeOne )
        return NULL;
    if ( pPars->iNodeOne )
        pPars->fVeryVerbose = (int)(i == pPars->iNodeOne);
    p->nNodesTried++;
clk = Abc_Clock();
    p->nDivs = Sfm_DecExtract( pNtk, pPars, pObj, &p->vObjRoots, &p->vObjGates, &p->vObjFanins, &p->vObjMap, &p->vGateTfi, &p->vGateTfo, &p->vObjMffc, &p->vObjInMffc, NULL, NULL );
p->timeWin += Abc_Clock() - clk;
    if ( pPars->nWinSizeMax && pPars->nWinSizeMax < Vec_IntSize(&p->vObjGates) )
        return NULL;
    p->nMffc = Vec_IntSize(&p->vObjMffc);
    p->AreaMffc = Sfm_DecMffcArea(pNtk, &p->vObjMffc);
    p->nMaxDivs = Abc_MaxInt( p->nMaxDivs, p->nDivs );
    p->nAllDivs += p->nDivs;
    p->iTarget = pObj->iTemp;
    Limit = Vec_IntSize( &p->vObjGates );
    p->nMaxWin = Abc_MaxInt( p->nMaxWin, Limit );
    p->nAllWin += Limit;
clk = Abc_Clock();
    RetValue = Sfm_DecPrepareSolver( p );
p->timeCnf += Abc_Clock() - clk;
    if ( !RetValue )
        return NULL;
clk = Abc_Clock();
    RetValue = Sfm_DecPeformDec2( p, pObj );
    if ( pPars->fMoreEffort && RetValue < 0 )
    {
        int Var, i;
        Vec_IntForEachEntryReverse( &p->vObjInMffc, Var, i )
        {
            p->iUseThis = Var; 
            RetValue = Sfm_DecPeformDec2( p, pObj );
            p->iUseThis = -1;
            if ( RetValue < 0 )
            {
                //printf( "Node %d: Not found among %d.\n", Abc_ObjId(pObj), Vec_IntSize(&p->vObjInMffc) );
            }
            else
            {
                p->nEfforts++;
                if ( p->pPars->fVerbose )
                {
                    //printf( "Node %5d: (%2d out of %2d)  Gate=%s ", Abc_ObjId(pObj), i, Vec_IntSize(&p->vObjInMffc), Mio_GateReadName((Mio_Gate_t*)pObj->pData) );
                    //Dau_DsdPrintFromTruth( p->Copy, p->nSuppVars );
                }
                break;
            }
        }
    }
    if ( p->pPars->fVeryVerbose )
        printf( "\n\n" );
p->timeSat += Abc_Clock() - clk;
    if ( RetValue < 0 )
        return NULL;
    p->nNodesChanged++;
    Abc_NtkCountStats( p, Limit );
    return Sfm_DecInsert( pNtk, pObj, Limit, &p->vObjGates, &p->vObjFanins, &p->vObjMap, &p->vGateHands, p->GateBuffer, p->GateInvert, &p->vGateFuncs, NULL, p->pMit );
}